

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_reader.cpp
# Opt level: O3

idx_t __thiscall
duckdb::ListColumnReader::ReadInternal<duckdb::TemplatedListReader>
          (ListColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          optional_ptr<duckdb::Vector,_true> result_out)

{
  ParquetColumnSchema *pPVar1;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *this_00;
  int iVar2;
  pointer pCVar3;
  undefined4 extraout_var;
  idx_t iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t offset;
  data_ptr_t pdVar8;
  data_ptr_t pdVar9;
  Vector *pVVar10;
  bool bVar11;
  DATA data;
  optional_ptr<duckdb::Vector,_true> local_88;
  undefined4 local_7c;
  idx_t local_78;
  Vector *local_70;
  data_ptr_t local_68;
  data_ptr_t local_60;
  DATA local_58;
  VectorCache *local_48;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *local_40;
  Vector *local_38;
  undefined4 extraout_var_00;
  
  local_78 = num_values;
  local_70 = result_out.ptr;
  local_68 = define_out;
  local_60 = repeat_out;
  local_58 = TemplatedListReader::Initialize((optional_ptr<duckdb::Vector,_true>)0x335d99);
  local_40 = &this->child_column_reader;
  pVVar10 = &this->read_vector;
  local_48 = &this->read_cache;
  offset = 0;
  local_38 = pVVar10;
  do {
    iVar4 = this->overflow_child_count;
    if (iVar4 == 0) {
      memset((this->child_defines).super_ByteBuffer.ptr,0,(this->child_defines).super_ByteBuffer.len
            );
      memset((this->child_repeats).super_ByteBuffer.ptr,0,(this->child_repeats).super_ByteBuffer.len
            );
      this_00 = local_40;
      pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(local_40);
      iVar2 = (*pCVar3->_vptr_ColumnReader[9])(pCVar3);
      uVar7 = CONCAT44(extraout_var,iVar2);
      if (0x7ff < uVar7) {
        uVar7 = 0x800;
      }
      duckdb::Vector::ResetFromCache((VectorCache *)pVVar10);
      pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(this_00);
      iVar2 = (*pCVar3->_vptr_ColumnReader[3])
                        (pCVar3,uVar7,this->child_defines_ptr,this->child_repeats_ptr,pVVar10);
      iVar4 = CONCAT44(extraout_var_00,iVar2);
      if (iVar4 == 0) {
        return offset;
      }
    }
    else {
      this->overflow_child_count = 0;
    }
    duckdb::Vector::Verify((ulong)pVVar10);
    local_88.ptr = local_70;
    optional_ptr<duckdb::Vector,_true>::CheckValid(&local_88);
    lVar5 = duckdb::ListVector::GetListSize(local_88.ptr);
    bVar11 = true;
    uVar7 = 0;
    pdVar8 = local_60;
    pdVar9 = local_68;
    uVar6 = local_78;
    do {
      pPVar1 = (this->super_ColumnReader).column_schema;
      if (pPVar1->max_repeat == (ulong)this->child_repeats_ptr[uVar7]) {
        local_58.result_ptr[offset - 1].length = local_58.result_ptr[offset - 1].length + 1;
      }
      else {
        if (uVar6 <= offset) {
          local_7c = (undefined4)CONCAT71((int7)((ulong)pPVar1 >> 8),1);
          goto LAB_00335fa5;
        }
        if ((ulong)this->child_defines_ptr[uVar7] < pPVar1->max_define) {
          if (pPVar1->max_define - 1 == (ulong)this->child_defines_ptr[uVar7]) {
            local_58.result_ptr[offset].offset = lVar5 + uVar7;
            local_58.result_ptr[offset].length = 0;
          }
          else {
            TemplatedListReader::HandleNull(&local_58,offset);
            pdVar8 = local_60;
            pdVar9 = local_68;
            uVar6 = local_78;
          }
        }
        else {
          local_58.result_ptr[offset].offset = lVar5 + uVar7;
          local_58.result_ptr[offset].length = 1;
        }
        if (pdVar8 != (data_ptr_t)0x0) {
          pdVar8[offset] = this->child_repeats_ptr[uVar7];
        }
        if (pdVar9 != (data_ptr_t)0x0) {
          pdVar9[offset] = this->child_defines_ptr[uVar7];
        }
        offset = offset + 1;
      }
      uVar7 = uVar7 + 1;
      bVar11 = uVar7 < iVar4;
    } while (uVar7 != iVar4);
    local_7c = 0;
    uVar7 = iVar4;
LAB_00335fa5:
    local_88.ptr = local_70;
    optional_ptr<duckdb::Vector,_true>::CheckValid(&local_88);
    pVVar10 = local_38;
    duckdb::ListVector::Append(local_88.ptr,local_38,uVar7,0);
    if ((bool)(offset == local_78 & bVar11)) {
      duckdb::Vector::Slice(pVVar10,(ulong)pVVar10,uVar7);
      this->overflow_child_count = iVar4 - uVar7;
      duckdb::Vector::Verify((ulong)pVVar10);
      if (this->overflow_child_count != 0) {
        uVar6 = 0;
        do {
          this->child_defines_ptr[uVar6] = this->child_defines_ptr[uVar7 + uVar6];
          this->child_repeats_ptr[uVar6] = this->child_repeats_ptr[uVar7 + uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar6 < this->overflow_child_count);
      }
    }
    if ((char)local_7c != '\0') {
      return offset;
    }
  } while( true );
}

Assistant:

idx_t ListColumnReader::ReadInternal(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out,
                                     optional_ptr<Vector> result_out) {
	idx_t result_offset = 0;
	auto data = OP::Initialize(result_out);

	// if an individual list is longer than STANDARD_VECTOR_SIZE we actually have to loop the child read to fill it
	bool finished = false;
	while (!finished) {
		idx_t child_actual_num_values = 0;

		// check if we have any overflow from a previous read
		if (overflow_child_count == 0) {
			// we don't: read elements from the child reader
			child_defines.zero();
			child_repeats.zero();
			// we don't know in advance how many values to read because of the beautiful repetition/definition setup
			// we just read (up to) a vector from the child column, and see if we have read enough
			// if we have not read enough, we read another vector
			// if we have read enough, we leave any unhandled elements in the overflow vector for a subsequent read
			auto child_req_num_values =
			    MinValue<idx_t>(STANDARD_VECTOR_SIZE, child_column_reader->GroupRowsAvailable());
			read_vector.ResetFromCache(read_cache);
			child_actual_num_values =
			    child_column_reader->Read(child_req_num_values, child_defines_ptr, child_repeats_ptr, read_vector);
		} else {
			// we do: use the overflow values
			child_actual_num_values = overflow_child_count;
			overflow_child_count = 0;
		}

		if (child_actual_num_values == 0) {
			// no more elements available: we are done
			break;
		}
		read_vector.Verify(child_actual_num_values);
		idx_t current_chunk_offset = OP::GetOffset(result_out);

		// hard-won piece of code this, modify at your own risk
		// the intuition is that we have to only collapse values into lists that are repeated *on this level*
		// the rest is pretty much handed up as-is as a single-valued list or NULL
		idx_t child_idx;
		for (child_idx = 0; child_idx < child_actual_num_values; child_idx++) {
			if (child_repeats_ptr[child_idx] == MaxRepeat()) {
				// value repeats on this level, append
				D_ASSERT(result_offset > 0);
				OP::HandleRepeat(data, result_offset - 1);
				continue;
			}

			if (result_offset >= num_values) {
				// we ran out of output space
				finished = true;
				break;
			}
			if (child_defines_ptr[child_idx] >= MaxDefine()) {
				// value has been defined down the stack, hence its NOT NULL
				OP::HandleListStart(data, result_offset, child_idx + current_chunk_offset, 1);
			} else if (child_defines_ptr[child_idx] == MaxDefine() - 1) {
				// empty list
				OP::HandleListStart(data, result_offset, child_idx + current_chunk_offset, 0);
			} else {
				// value is NULL somewhere up the stack
				OP::HandleNull(data, result_offset);
			}

			if (repeat_out) {
				repeat_out[result_offset] = child_repeats_ptr[child_idx];
			}
			if (define_out) {
				define_out[result_offset] = child_defines_ptr[child_idx];
			}

			result_offset++;
		}
		// actually append the required elements to the child list
		OP::AppendVector(result_out, read_vector, child_idx);

		// we have read more values from the child reader than we can fit into the result for this read
		// we have to pass everything from child_idx to child_actual_num_values into the next call
		if (child_idx < child_actual_num_values && result_offset == num_values) {
			read_vector.Slice(read_vector, child_idx, child_actual_num_values);
			overflow_child_count = child_actual_num_values - child_idx;
			read_vector.Verify(overflow_child_count);

			// move values in the child repeats and defines *backward* by child_idx
			for (idx_t repdef_idx = 0; repdef_idx < overflow_child_count; repdef_idx++) {
				child_defines_ptr[repdef_idx] = child_defines_ptr[child_idx + repdef_idx];
				child_repeats_ptr[repdef_idx] = child_repeats_ptr[child_idx + repdef_idx];
			}
		}
	}
	return result_offset;
}